

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::PermuteProgram(Alice *this)

{
  allocator<std::vector<long,_std::allocator<long>_>_> *this_00;
  allocator<Instruction> *this_01;
  int iVar1;
  value_type vVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Server *this_02;
  reference pvVar6;
  ostream *poVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference this_03;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *pvVar11;
  vector<int,_std::allocator<int>_> *this_04;
  vector<Instruction,_std::allocator<Instruction>_> local_100;
  int local_e8;
  int local_e4;
  int j_1;
  int i_1;
  int j;
  int i;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  local_d0;
  Instruction *local_c8;
  __normal_iterator<Instruction_*,_std::vector<Instruction,_std::allocator<Instruction>_>_> local_c0
  ;
  vector<Instruction,_std::allocator<Instruction>_> local_b8;
  allocator<Instruction> local_99;
  undefined1 local_98 [8];
  vector<Instruction,_std::allocator<Instruction>_> Temp;
  undefined1 local_78 [8];
  vector<Instruction,_std::allocator<Instruction>_> V;
  undefined1 local_58 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  S;
  allocator<std::vector<long,_std::allocator<long>_>_> local_29;
  undefined1 local_28 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Pi_R_P;
  Alice *this_local;
  
  iVar1 = (this->super_Party).n_p;
  Pi_R_P.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator(&local_29);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_28,(long)iVar1,&local_29);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator(&local_29);
  iVar1 = (this->super_Party).n_p;
  this_00 = (allocator<std::vector<long,_std::allocator<long>_>_> *)
            ((long)&V.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator(this_00);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_58,(long)iVar1,this_00);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
            ((allocator<std::vector<long,_std::allocator<long>_>_> *)
             ((long)&V.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar1 = (this->super_Party).n_p;
  this_01 = (allocator<Instruction> *)
            ((long)&Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Instruction>::allocator(this_01);
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_78,(long)iVar1,this_01);
  std::allocator<Instruction>::~allocator
            ((allocator<Instruction> *)
             ((long)&Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar1 = (this->super_Party).n_p;
  std::allocator<Instruction>::allocator(&local_99);
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_98,(long)iVar1,&local_99);
  std::allocator<Instruction>::~allocator(&local_99);
  Server::ReceiveProgramVector(&local_b8,this->srv);
  std::vector<Instruction,_std::allocator<Instruction>_>::operator=
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_78,&local_b8);
  std::vector<Instruction,_std::allocator<Instruction>_>::~vector(&local_b8);
  local_c0._M_current =
       (Instruction *)
       std::vector<Instruction,_std::allocator<Instruction>_>::begin
                 ((vector<Instruction,_std::allocator<Instruction>_> *)local_78);
  local_c8 = (Instruction *)
             std::vector<Instruction,_std::allocator<Instruction>_>::end
                       ((vector<Instruction,_std::allocator<Instruction>_> *)local_78);
  std::vector<Instruction,std::allocator<Instruction>>::
  assign<__gnu_cxx::__normal_iterator<Instruction*,std::vector<Instruction,std::allocator<Instruction>>>,void>
            ((vector<Instruction,std::allocator<Instruction>> *)local_98,local_c0,
             (__normal_iterator<Instruction_*,_std::vector<Instruction,_std::allocator<Instruction>_>_>
              )local_c8);
  pvVar11 = &(this->super_Party).P;
  local_d0._M_current =
       (vector<long,_std::allocator<long>_> *)
       std::
       vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
       ::begin(pvVar11);
  _j = std::
       vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
       ::end(pvVar11);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  assign<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,void>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)local_58,local_d0,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )_j);
  std::operator<<((ostream *)&std::cout,"Permutation Pi_A: ");
  for (i_1 = 0; i_1 < (this->super_Party).n_p; i_1 = i_1 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&(this->super_Party).Pi_P,(long)i_1)
    ;
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar6);
    std::operator<<(poVar7," ");
    for (j_1 = 0; j_1 < 5; j_1 = j_1 + 1) {
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_58,(long)i_1);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)j_1);
      vVar2 = *pvVar9;
      this_04 = &(this->super_Party).Pi_P;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_04,(long)i_1);
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).P,(long)*pvVar6);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)j_1);
      *pvVar9 = vVar2;
      pvVar10 = std::vector<Instruction,_std::allocator<Instruction>_>::operator[]
                          ((vector<Instruction,_std::allocator<Instruction>_> *)local_98,(long)i_1);
      lVar3 = pvVar10->val[j_1];
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_04,(long)i_1);
      pvVar10 = std::vector<Instruction,_std::allocator<Instruction>_>::operator[]
                          ((vector<Instruction,_std::allocator<Instruction>_> *)local_78,
                           (long)*pvVar6);
      pvVar10->val[j_1] = lVar3;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_04,(long)i_1);
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_28,(long)*pvVar6);
      this_03 = std::
                vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ::operator[](&(this->super_Party).R_P,(long)i_1);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](this_03,(long)j_1);
      std::vector<long,_std::allocator<long>_>::push_back(pvVar8,pvVar9);
    }
  }
  std::operator<<((ostream *)&std::cout,"\nAlice\'s Permuted Program P_A:\n ");
  for (local_e4 = 0; local_e4 < (this->super_Party).n_p; local_e4 = local_e4 + 1) {
    for (local_e8 = 0; local_e8 < 5; local_e8 = local_e8 + 1) {
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).U_P,(long)local_e4);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)local_e8);
      lVar3 = *pvVar9;
      pvVar11 = &(this->super_Party).P;
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](pvVar11,(long)local_e4);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)local_e8);
      *pvVar9 = *pvVar9 + lVar3;
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](pvVar11,(long)local_e4);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)local_e8);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar9);
      std::operator<<(poVar7," ");
      pvVar10 = std::vector<Instruction,_std::allocator<Instruction>_>::operator[]
                          ((vector<Instruction,_std::allocator<Instruction>_> *)local_78,
                           (long)local_e4);
      lVar3 = pvVar10->val[local_e8];
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_28,(long)local_e4);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)local_e8);
      lVar4 = *pvVar9;
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).U_P,(long)local_e4);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)local_e8);
      lVar5 = *pvVar9;
      pvVar10 = std::vector<Instruction,_std::allocator<Instruction>_>::operator[]
                          ((vector<Instruction,_std::allocator<Instruction>_> *)local_78,
                           (long)local_e4);
      pvVar10->val[local_e8] = (lVar3 - lVar4) - lVar5;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  this_02 = this->srv;
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            (&local_100,(vector<Instruction,_std::allocator<Instruction>_> *)local_78);
  Server::SendProgramVector(this_02,&local_100,(this->super_Party).n_p);
  std::vector<Instruction,_std::allocator<Instruction>_>::~vector(&local_100);
  std::vector<Instruction,_std::allocator<Instruction>_>::~vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_98);
  std::vector<Instruction,_std::allocator<Instruction>_>::~vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_78);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_58);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_28);
  return;
}

Assistant:

void Alice::PermuteProgram()
{
    std::vector<std::vector<long>> Pi_R_P(n_p), S(n_p);
    std::vector<Instruction> V(n_p), Temp(n_p);
    V = srv->ReceiveProgramVector();    //receive Bob's masked share of P
    Temp.assign(V.begin(), V.end());
    S.assign(P.begin(), P.end());
    std::cout<<"Permutation Pi_A: ";
    for(int i=0; i < n_p; i++)
    {
        std::cout<<Pi_P[i]<<" ";
        for(int j=0;  j < 5; j++)
        {
            P[Pi_P[i]][j] = S[i][j]; //Applying Pi on Alice's Share of P
            V[Pi_P[i]].val[j] = Temp[i].val[j]; //Applying Pi on Bob's masked Share of P
            Pi_R_P[Pi_P[i]].push_back(R_P[i][j]);  //Prepping shuffle vector needed for resplit
        }
    }
    std::cout<<"\nAlice's Permuted Program P_A:\n ";
    for(int i=0; i < n_p; i++)
    {
        for(int j=0;  j < 5; j++)
        {
            P[i][j] += U_P[i][j];   //resplitting Alice's share of P
            std::cout<<P[i][j]<<" ";
            V[i].val[j] = V[i].val[j] - Pi_R_P[i][j] - U_P[i][j]; //resplitting Bob's share of P
        }
        std::cout<<std::endl;
    }
    srv->SendProgramVector(V, n_p); //sending Bob's his BlindPermuted share of P
}